

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

void __thiscall pstore::file::file_handle::file_handle(file_handle *this,file_handle *other)

{
  file_handle *other_local;
  file_handle *this_local;
  
  file_base::file_base(&this->super_file_base);
  (this->super_file_base)._vptr_file_base = (_func_int **)&PTR__file_handle_001a98c0;
  std::__cxx11::string::string((string *)&this->path_,(string *)&other->path_);
  this->file_ = other->file_;
  this->is_writable_ = (bool)(other->is_writable_ & 1);
  other->file_ = -1;
  other->is_writable_ = false;
  return;
}

Assistant:

file_handle::file_handle (file_handle && other) noexcept
                : path_{std::move (other.path_)}
                , file_{other.file_}
                , is_writable_{other.is_writable_} {

            other.file_ = invalid_oshandle;
            other.is_writable_ = false;
        }